

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O2

Span * __thiscall tcmalloc::PageHeap::Carve(PageHeap *this,Span *span,uint64_t n)

{
  PageMap *this_00;
  uint64_t *puVar1;
  ulong uVar2;
  uint64_t uVar3;
  bool bVar4;
  Span *span_00;
  uint64_t npages;
  
  uVar2 = span->npages;
  uVar3 = span->location;
  span->location = 0;
  npages = uVar2 - n;
  if (uVar2 < n || npages == 0) {
    puVar1 = &(this->stat).in_used_bytes;
    *puVar1 = *puVar1 + uVar2 * 0x2000;
  }
  else {
    span_00 = NewSpan(span->page_id + n,npages);
    span->npages = n;
    if (span_00 == (Span *)0x0) {
      __assert_fail("new_span != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf5,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    this_00 = &this->page_map_;
    bVar4 = PageMap::Set(this_00,(span->page_id + n) - 1,span);
    if (!bVar4) {
      __assert_fail("page_map_.Set(span->page_id + n - 1, span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf6,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    bVar4 = PageMap::Set(this_00,span_00->page_id,span_00);
    if (!bVar4) {
      __assert_fail("page_map_.Set(new_span->page_id, new_span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf7,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    bVar4 = PageMap::Set(this_00,(npages + span_00->page_id) - 1,span_00);
    if (!bVar4) {
      __assert_fail("page_map_.Set(new_span->page_id + extra -1, new_span)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xf8,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
    span_00->location = uVar3;
    InsertToFreeList(this,span_00);
    puVar1 = &(this->stat).in_used_bytes;
    *puVar1 = *puVar1 + span->npages * 0x2000;
    bVar4 = CheckSmallList(this);
    if (!bVar4) {
      __assert_fail("CheckSmallList()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0xfd,"Span *tcmalloc::PageHeap::Carve(Span *, uint64_t)");
    }
  }
  return span;
}

Assistant:

Span* Carve(Span* span, uint64_t n) {
        auto old_location = span->location;
        span->location = Span::IN_USE;
        if (span->npages <= n) {
            stat.in_used_bytes += span->npages * spanPageSize;
            return span;
        }

        uint64_t extra = span->npages - n;
        Span* new_span = NewSpan(span->page_id + n, extra);

        span->npages = n;
        // oom
        assert(new_span != nullptr);
        assert(page_map_.Set(span->page_id + n - 1, span));
        assert(page_map_.Set(new_span->page_id, new_span));
        assert(page_map_.Set(new_span->page_id + extra -1, new_span));

        new_span->location = old_location;
        InsertToFreeList(new_span);
        stat.in_used_bytes += span->npages * spanPageSize;
        assert(CheckSmallList());
        return span;
    }